

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

char * __thiscall CClient::DemoPlayer_Play(CClient *this,char *pFilename,int StorageType)

{
  CDemoPlayer *this_00;
  int iVar1;
  uint WantedCrc;
  undefined4 extraout_var;
  char *pReason;
  
  (*(this->super_IClient).super_IInterface._vptr_IInterface[3])();
  CNetClient::ResetErrorString(&this->m_NetClient);
  this_00 = &this->m_DemoPlayer;
  CDemoPlayer::SetListener(this_00,&this->super_IListener);
  iVar1 = (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[0x13])();
  pReason = CDemoPlayer::Load(this_00,pFilename,StorageType,(char *)CONCAT44(extraout_var,iVar1));
  if (pReason == (char *)0x0) {
    WantedCrc = bytes_be_to_uint((this->m_DemoPlayer).m_Info.m_Header.m_aMapCrc);
    pReason = LoadMapSearch(this,(this->m_DemoPlayer).m_Info.m_Header.m_aMapName,
                            (SHA256_DIGEST *)0x0,WantedCrc);
    if (pReason == (char *)0x0) {
      (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[0xc])();
      mem_zero(this->m_aDemorecSnapshotData,0x200000);
      this->m_aSnapshots[0] = this->m_aDemorecSnapshotHolders;
      this->m_aSnapshots[1] = this->m_aDemorecSnapshotHolders + 1;
      this->m_aDemorecSnapshotHolders[0].m_pSnap = (CSnapshot *)this->m_aDemorecSnapshotData;
      this->m_aDemorecSnapshotHolders[0].m_pAltSnap =
           (CSnapshot *)(this->m_aDemorecSnapshotData[0] + 1);
      this->m_aDemorecSnapshotHolders[0].m_Tick = -1;
      this->m_aDemorecSnapshotHolders[0].m_SnapSize = 0;
      this->m_aDemorecSnapshotHolders[1].m_pSnap = (CSnapshot *)(this->m_aDemorecSnapshotData + 1);
      this->m_aDemorecSnapshotHolders[1].m_pAltSnap =
           (CSnapshot *)(this->m_aDemorecSnapshotData[1] + 1);
      this->m_aDemorecSnapshotHolders[1].m_Tick = -1;
      this->m_aDemorecSnapshotHolders[1].m_SnapSize = 0;
      SetState(this,4);
      CDemoPlayer::Play(this_00);
      (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[7])();
      pReason = (char *)0x0;
    }
    else {
      DisconnectWithReason(this,pReason);
    }
  }
  return pReason;
}

Assistant:

const char *CClient::DemoPlayer_Play(const char *pFilename, int StorageType)
{
	Disconnect();
	m_NetClient.ResetErrorString();

	// try to start playback
	m_DemoPlayer.SetListener(this);

	const char *pError = m_DemoPlayer.Load(pFilename, StorageType, GameClient()->NetVersion());
	if(pError)
		return pError;

	// load map
	const unsigned Crc = bytes_be_to_uint(m_DemoPlayer.Info()->m_Header.m_aMapCrc);
	pError = LoadMapSearch(m_DemoPlayer.Info()->m_Header.m_aMapName, 0, Crc);
	if(pError)
	{
		DisconnectWithReason(pError);
		return pError;
	}

	GameClient()->OnConnected();

	// setup buffers
	mem_zero(m_aDemorecSnapshotData, sizeof(m_aDemorecSnapshotData));

	m_aSnapshots[SNAP_CURRENT] = &m_aDemorecSnapshotHolders[SNAP_CURRENT];
	m_aSnapshots[SNAP_PREV] = &m_aDemorecSnapshotHolders[SNAP_PREV];

	m_aSnapshots[SNAP_CURRENT]->m_pSnap = (CSnapshot *)m_aDemorecSnapshotData[SNAP_CURRENT][0];
	m_aSnapshots[SNAP_CURRENT]->m_pAltSnap = (CSnapshot *)m_aDemorecSnapshotData[SNAP_CURRENT][1];
	m_aSnapshots[SNAP_CURRENT]->m_SnapSize = 0;
	m_aSnapshots[SNAP_CURRENT]->m_Tick = -1;

	m_aSnapshots[SNAP_PREV]->m_pSnap = (CSnapshot *)m_aDemorecSnapshotData[SNAP_PREV][0];
	m_aSnapshots[SNAP_PREV]->m_pAltSnap = (CSnapshot *)m_aDemorecSnapshotData[SNAP_PREV][1];
	m_aSnapshots[SNAP_PREV]->m_SnapSize = 0;
	m_aSnapshots[SNAP_PREV]->m_Tick = -1;

	// enter demo playback state
	SetState(IClient::STATE_DEMOPLAYBACK);

	m_DemoPlayer.Play();
	GameClient()->OnEnterGame();

	return 0;
}